

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O3

shared_ptr<miniros::master::NodeRef> __thiscall
miniros::master::RegistrationManager::getNodeByAPIUnsafe(RegistrationManager *this,string *api)

{
  undefined4 uVar1;
  _Alloc_hider _Var2;
  int iVar3;
  _Base_ptr in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  bool bVar6;
  undefined1 auVar7 [16];
  shared_ptr<miniros::master::NodeRef> sVar8;
  string local_50;
  
  p_Var5 = *(_Rb_tree_node_base **)((long)&api[0xb].field_2 + 8);
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  if (p_Var5 != (_Rb_tree_node_base *)&api[0xb]._M_string_length) {
    do {
      NodeRef::getApi_abi_cxx11_(&local_50,*(NodeRef **)(p_Var5 + 2));
      _Var2._M_p = local_50._M_dataplus._M_p;
      if ((_Base_ptr)local_50._M_string_length == in_RDX->_M_parent) {
        if ((_Base_ptr)local_50._M_string_length == (_Base_ptr)0x0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,*(void **)in_RDX,local_50._M_string_length);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50.field_2) {
        operator_delete(_Var2._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        uVar1 = *(undefined4 *)&p_Var5[2].field_0x4;
        *(_Rb_tree_color *)&(this->publishers).map._M_t._M_impl.field_0x0 = p_Var5[2]._M_color;
        *(undefined4 *)&(this->publishers).map._M_t._M_impl.field_0x4 = uVar1;
        _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[2]._M_parent;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &(this->publishers).map._M_t._M_impl.super__Rb_tree_header._M_header = _Var4._M_pi;
        if ((_Base_ptr)_Var4._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)_Var4._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)_Var4._M_pi)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)_Var4._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)_Var4._M_pi)->_M_parent + 1;
          }
        }
        goto LAB_0023b469;
      }
      auVar7 = ::std::_Rb_tree_increment(p_Var5);
      _Var4._M_pi = auVar7._8_8_;
      p_Var5 = auVar7._0_8_;
    } while (p_Var5 != (_Rb_tree_node_base *)&api[0xb]._M_string_length);
  }
  *(undefined8 *)&(this->publishers).map._M_t._M_impl = 0;
  *(undefined8 *)&(this->publishers).map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_0023b469:
  sVar8.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar8.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<miniros::master::NodeRef>)
         sVar8.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<NodeRef> RegistrationManager::getNodeByAPIUnsafe(const std::string& api) const
{
  for (auto it = m_nodes.begin(); it != m_nodes.end(); it++) {
    if (it->second->getApi() == api)
      return it->second;
  }
  return {};
}